

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv__emfile_trick(uv_loop_t *loop,int accept_fd)

{
  int iVar1;
  bool local_25;
  int emfile_fd;
  int err;
  int accept_fd_local;
  uv_loop_t *loop_local;
  
  if (loop->emfile_fd == -1) {
    loop_local._4_4_ = -0x18;
  }
  else {
    uv__close(loop->emfile_fd);
    loop->emfile_fd = -1;
    do {
      loop_local._4_4_ = uv__accept(accept_fd);
      if (-1 < loop_local._4_4_) {
        uv__close(loop_local._4_4_);
      }
      local_25 = -1 < loop_local._4_4_ || loop_local._4_4_ == -4;
    } while (local_25);
    iVar1 = uv__open_cloexec("/",0);
    if (-1 < iVar1) {
      loop->emfile_fd = iVar1;
    }
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__emfile_trick(uv_loop_t* loop, int accept_fd) {
  int err;
  int emfile_fd;

  if (loop->emfile_fd == -1)
    return UV_EMFILE;

  uv__close(loop->emfile_fd);
  loop->emfile_fd = -1;

  do {
    err = uv__accept(accept_fd);
    if (err >= 0)
      uv__close(err);
  } while (err >= 0 || err == UV_EINTR);

  emfile_fd = uv__open_cloexec("/", O_RDONLY);
  if (emfile_fd >= 0)
    loop->emfile_fd = emfile_fd;

  return err;
}